

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

int __thiscall
flow::RetInstr::clone(RetInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  unique_ptr<flow::RetInstr,_std::default_delete<flow::RetInstr>_> local_20;
  __fn *local_18;
  RetInstr *this_local;
  
  local_18 = __fn;
  this_local = this;
  Instr::operand((Instr *)__fn,0);
  std::make_unique<flow::RetInstr,flow::Value*>((Value **)&local_20);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::RetInstr,std::default_delete<flow::RetInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,&local_20);
  std::unique_ptr<flow::RetInstr,_std::default_delete<flow::RetInstr>_>::~unique_ptr(&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> RetInstr::clone() {
  return std::make_unique<RetInstr>(operand(0));
}